

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int *piVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  ImVec4 *pIVar8;
  undefined8 uVar9;
  void *__src;
  ImDrawChannel *__dest;
  long lVar10;
  void *pvVar11;
  char *__function;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uStack_34;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0x528,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar3 = (this->_Channels).Size;
  iVar12 = iVar3;
  if (iVar3 < channels_count) {
    iVar12 = (this->_Channels).Capacity;
    if (iVar12 < channels_count) {
      if (iVar12 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar12 / 2 + iVar12;
      }
      if (iVar12 <= channels_count) {
        iVar12 = channels_count;
      }
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar12 << 5);
      pIVar6 = (this->_Channels).Data;
      if (pIVar6 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar6,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = iVar12;
    }
    (this->_Channels).Size = channels_count;
    iVar12 = channels_count;
  }
  this->_Count = channels_count;
  if (0 < iVar12) {
    pIVar6 = (this->_Channels).Data;
    (pIVar6->_IdxBuffer).Size = 0;
    (pIVar6->_IdxBuffer).Capacity = 0;
    (pIVar6->_IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar6->_CmdBuffer).Size = 0;
    (pIVar6->_CmdBuffer).Capacity = 0;
    (pIVar6->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar13 = 1;
      lVar14 = 0x38;
      do {
        lVar10 = (long)(this->_Channels).Size;
        if ((long)uVar13 < (long)iVar3) {
          if (lVar10 <= (long)uVar13) goto LAB_0012c640;
          pIVar6 = (this->_Channels).Data;
          if (*(int *)((long)pIVar6 + lVar14 + -0x14) < 0) {
            pvVar11 = ImGui::MemAlloc(0);
            pvVar7 = *(void **)((long)pIVar6 + lVar14 + -0x10);
            if (pvVar7 != (void *)0x0) {
              memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar6 + lVar14 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar6 + lVar14 + -0x10));
            }
            *(void **)((long)pIVar6 + lVar14 + -0x10) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar14 + -0x14) = 0;
            lVar10 = (long)(this->_Channels).Size;
          }
          *(undefined4 *)((long)pIVar6 + lVar14 + -0x18) = 0;
          if (lVar10 <= (long)uVar13) goto LAB_0012c640;
          pIVar6 = (this->_Channels).Data;
          if (*(int *)((long)pIVar6 + lVar14 + -4) < 0) {
            pvVar11 = ImGui::MemAlloc(0);
            pvVar7 = *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar14);
            if (pvVar7 != (void *)0x0) {
              memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar6 + lVar14 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar14));
            }
            *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar14) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar14 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar6 + lVar14 + -8) = 0;
        }
        else {
          if (lVar10 <= (long)uVar13) goto LAB_0012c640;
          pIVar6 = (this->_Channels).Data;
          puVar1 = (undefined8 *)((long)pIVar6 + lVar14 + -8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar6 + lVar14 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        if ((long)(this->_Channels).Size <= (long)uVar13) goto LAB_0012c640;
        pIVar6 = (this->_Channels).Data;
        if (*(int *)((long)pIVar6 + lVar14 + -0x18) == 0) {
          lVar10 = (long)(draw_list->_ClipRectStack).Size;
          if (lVar10 < 1) {
            __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0012c68b:
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                          ,0x538,__function);
          }
          pIVar8 = (draw_list->_ClipRectStack).Data;
          fVar4 = pIVar8[lVar10 + -1].x;
          fVar5 = pIVar8[lVar10 + -1].w;
          uVar9 = *(undefined8 *)&pIVar8[lVar10 + -1].y;
          lVar10 = (long)(draw_list->_TextureIdStack).Size;
          if (lVar10 < 1) {
            __function = "T &ImVector<void *>::back() [T = void *]";
            goto LAB_0012c68b;
          }
          pvVar7 = (draw_list->_TextureIdStack).Data[lVar10 + -1];
          if (*(int *)((long)pIVar6 + lVar14 + -0x14) == 0) {
            pvVar11 = ImGui::MemAlloc(0x1c0);
            __src = *(void **)((long)pIVar6 + lVar14 + -0x10);
            if (__src != (void *)0x0) {
              memcpy(pvVar11,__src,(long)*(int *)((long)pIVar6 + lVar14 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar6 + lVar14 + -0x10));
            }
            *(void **)((long)pIVar6 + lVar14 + -0x10) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar14 + -0x14) = 8;
            lVar10 = (long)*(int *)((long)pIVar6 + lVar14 + -0x18);
          }
          else {
            pvVar11 = *(void **)((long)pIVar6 + lVar14 + -0x10);
            lVar10 = 0;
          }
          lVar10 = lVar10 * 0x38;
          *(ulong *)((long)pvVar11 + lVar10) = (ulong)(uint)fVar4 << 0x20;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar10 + 8);
          *puVar1 = uVar9;
          puVar1[1] = CONCAT44(uStack_34,fVar5);
          *(void **)((long)pvVar11 + lVar10 + 0x18) = pvVar7;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar10 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pvVar11 + lVar10 + 0x30) = 0;
          piVar2 = (int *)((long)pIVar6 + lVar14 + -0x18);
          *piVar2 = *piVar2 + 1;
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x20;
      } while ((uint)channels_count != uVar13);
    }
    return;
  }
LAB_0012c640:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x52e,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}